

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int alsa_stream_get_position(cubeb_stream_conflict1 *stm,uint64_t *position)

{
  snd_pcm_state_t sVar1;
  int iVar2;
  long *in_RSI;
  long in_RDI;
  snd_pcm_sframes_t delay;
  ulong local_20;
  long *local_18;
  long local_10;
  
  if ((in_RDI == 0) || (in_RSI == (long *)0x0)) {
    __assert_fail("stm && position",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                  ,0x544,"int alsa_stream_get_position(cubeb_stream *, uint64_t *)");
  }
  local_18 = in_RSI;
  local_10 = in_RDI;
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x10));
  local_20 = 0xffffffffffffffff;
  sVar1 = (*cubeb_snd_pcm_state)(*(snd_pcm_t **)(local_10 + 0x38));
  if ((sVar1 == SND_PCM_STATE_RUNNING) &&
     (iVar2 = (*cubeb_snd_pcm_delay)
                        (*(snd_pcm_t **)(local_10 + 0x38),(snd_pcm_sframes_t *)&local_20),
     iVar2 == 0)) {
    if (-1 < (long)local_20) {
      *local_18 = 0;
      if (local_20 <= *(ulong *)(local_10 + 0x50)) {
        *local_18 = *(long *)(local_10 + 0x50) - local_20;
      }
      *(long *)(local_10 + 0x58) = *local_18;
      pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 0x10));
      return 0;
    }
    __assert_fail("delay >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                  ,0x550,"int alsa_stream_get_position(cubeb_stream *, uint64_t *)");
  }
  *local_18 = *(long *)(local_10 + 0x58);
  pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 0x10));
  return 0;
}

Assistant:

static int
alsa_stream_get_position(cubeb_stream * stm, uint64_t * position)
{
  snd_pcm_sframes_t delay;

  assert(stm && position);

  pthread_mutex_lock(&stm->mutex);

  delay = -1;
  if (WRAP(snd_pcm_state)(stm->pcm) != SND_PCM_STATE_RUNNING ||
      WRAP(snd_pcm_delay)(stm->pcm, &delay) != 0) {
    *position = stm->last_position;
    pthread_mutex_unlock(&stm->mutex);
    return CUBEB_OK;
  }

  assert(delay >= 0);

  *position = 0;
  if (stm->stream_position >= (snd_pcm_uframes_t)delay) {
    *position = stm->stream_position - delay;
  }

  stm->last_position = *position;

  pthread_mutex_unlock(&stm->mutex);
  return CUBEB_OK;
}